

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::PulseStyleDeclarationSyntax
          (PulseStyleDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  iterator_base<slang::syntax::NameSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PulseStyleDeclaration,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar3 = *(undefined4 *)&(inputs->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (inputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (inputs->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->inputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (inputs->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->inputs).super_SyntaxListBase.childCount = (inputs->super_SyntaxListBase).childCount;
  (this->inputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00599718;
  sVar1 = (inputs->elements)._M_extent._M_extent_value;
  (this->inputs).elements._M_ptr = (inputs->elements)._M_ptr;
  (this->inputs).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->inputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->inputs).elements._M_extent._M_extent_value;
  local_30.list = &this->inputs;
  for (; (local_30.list != &this->inputs || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pNVar4 = SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::dereference(&local_30);
    (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PulseStyleDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<NameSyntax>& inputs, Token semi) :
        MemberSyntax(SyntaxKind::PulseStyleDeclaration, attributes), keyword(keyword), inputs(inputs), semi(semi) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
    }